

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  size_type *psVar5;
  ulong uVar6;
  ctrl_t *pcVar7;
  slot_type *psVar8;
  pointer pcVar9;
  ulong *puVar10;
  size_type sVar11;
  slot_type *psVar12;
  undefined1 auVar13 [16];
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined8 uVar29;
  size_type sVar30;
  ctrl_t *pcVar31;
  size_t sVar32;
  ulong uVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  ulong uVar36;
  byte bVar37;
  size_t i;
  FindInfo FVar38;
  type raw;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_59;
  ulong *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong uStack_40;
  unsigned_long local_38;
  
  uVar6 = this->capacity_;
  if ((uVar6 == 0) || ((uVar6 + 1 & uVar6) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
                 );
  }
  if (uVar6 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
                 );
  }
  pcVar7 = this->ctrl_;
  if (pcVar7[uVar6] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar31 = pcVar7 + uVar6;
  if (pcVar31 + 1 != pcVar7) {
    uVar36 = 0;
    do {
      pcVar1 = pcVar7 + uVar36;
      cVar14 = pcVar1[1];
      cVar15 = pcVar1[2];
      cVar16 = pcVar1[3];
      cVar17 = pcVar1[4];
      cVar18 = pcVar1[5];
      cVar19 = pcVar1[6];
      cVar20 = pcVar1[7];
      cVar21 = pcVar1[8];
      cVar22 = pcVar1[9];
      cVar23 = pcVar1[10];
      cVar24 = pcVar1[0xb];
      cVar25 = pcVar1[0xc];
      cVar26 = pcVar1[0xd];
      cVar27 = pcVar1[0xe];
      cVar28 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar7 + uVar36);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar24 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar25 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar26 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar27 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar28 < '\0') & 0x7eU ^ 0xfe;
      uVar36 = uVar36 + 0x10;
    } while (uVar6 + 1 != uVar36);
  }
  uVar29 = *(undefined8 *)(pcVar7 + 8);
  *(undefined8 *)(pcVar31 + 1) = *(undefined8 *)pcVar7;
  *(undefined8 *)(pcVar31 + 9) = uVar29;
  *pcVar31 = -1;
  sVar32 = this->capacity_;
  if (sVar32 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar32 = std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_59,&this->slots_[i].value.first);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = sVar32;
        uVar36 = SUB168(auVar13 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar13 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar38 = find_first_non_full(this,uVar36);
        sVar32 = FVar38.offset;
        uVar6 = this->capacity_;
        if ((uVar6 + 1 & uVar6) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar33 = uVar36 >> 7 & uVar6;
        bVar37 = (byte)uVar36;
        if (((i - uVar33 ^ sVar32 - uVar33) & uVar6) < 0x10) {
          bVar37 = bVar37 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar32] == -2) {
            set_ctrl(this,sVar32,bVar37 & 0x7f);
            local_58 = &local_48;
            psVar3 = this->slots_ + i;
            paVar34 = &(psVar3->value).first.field_2;
            puVar10 = (ulong *)(psVar3->value).first._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10 == paVar34) {
              local_48 = paVar34->_M_allocated_capacity;
              uStack_40 = *(ulong *)((long)&(psVar3->value).first.field_2 + 8);
            }
            else {
              local_48 = paVar34->_M_allocated_capacity;
              local_58 = puVar10;
            }
            psVar3 = this->slots_ + i;
            sVar11 = (psVar3->value).first._M_string_length;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)psVar3 = paVar34;
            (psVar3->key)._M_string_length = 0;
            (psVar3->value).first.field_2._M_local_buf[0] = '\0';
            local_38 = (psVar3->value).second;
            psVar12 = this->slots_;
            psVar3 = psVar12 + i;
            psVar5 = (size_type *)((long)psVar12 + i * 0x28 + 0x10);
            psVar5[-2] = (size_type)psVar5;
            psVar4 = psVar12 + sVar32;
            paVar34 = &(psVar4->value).first.field_2;
            pcVar9 = (psVar4->value).first._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar9 == paVar34) {
              sVar30 = *(size_type *)((long)&(psVar4->value).first.field_2 + 8);
              *psVar5 = paVar34->_M_allocated_capacity;
              psVar5[1] = sVar30;
            }
            else {
              (psVar3->value).first._M_dataplus._M_p = pcVar9;
              (psVar3->value).first.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
            }
            psVar12 = psVar12 + sVar32;
            (psVar3->value).first._M_string_length = (psVar12->value).first._M_string_length;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)psVar12 = paVar34;
            (psVar12->key)._M_string_length = 0;
            (psVar12->value).first.field_2._M_local_buf[0] = '\0';
            (psVar3->value).second = (psVar12->value).second;
            psVar3 = this->slots_ + sVar32;
            puVar10 = (ulong *)((long)this->slots_ + sVar32 * 0x28 + 0x10);
            puVar10[-2] = (ulong)puVar10;
            if (local_58 == &local_48) {
              *puVar10 = local_48;
              puVar10[1] = uStack_40;
            }
            else {
              (psVar3->value).first._M_dataplus._M_p = (pointer)local_58;
              (psVar3->value).first.field_2._M_allocated_capacity = local_48;
            }
            (psVar3->value).first._M_string_length = sVar11;
            local_50 = 0;
            local_48 = local_48 & 0xffffffffffffff00;
            (psVar3->value).second = local_38;
            i = i - 1;
            local_58 = &local_48;
            goto LAB_001fb2c6;
          }
          if (this->ctrl_[sVar32] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
                         );
          }
          set_ctrl(this,sVar32,bVar37 & 0x7f);
          psVar8 = this->slots_;
          psVar3 = psVar8 + sVar32;
          psVar4 = psVar8 + sVar32;
          paVar35 = &(psVar4->value).first.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)psVar4 = paVar35;
          psVar12 = psVar8 + i;
          paVar34 = &(psVar12->value).first.field_2;
          pcVar9 = (psVar12->value).first._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar9 == paVar34) {
            uVar29 = *(undefined8 *)((long)&(psVar12->value).first.field_2 + 8);
            paVar35->_M_allocated_capacity = paVar34->_M_allocated_capacity;
            *(undefined8 *)((long)&(psVar4->value).first.field_2 + 8) = uVar29;
          }
          else {
            (psVar3->value).first._M_dataplus._M_p = pcVar9;
            (psVar3->value).first.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          }
          psVar8 = psVar8 + i;
          (psVar3->value).first._M_string_length = (psVar8->value).first._M_string_length;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)psVar8 = paVar34;
          (psVar8->key)._M_string_length = 0;
          (psVar8->value).first.field_2._M_local_buf[0] = '\0';
          (psVar3->value).second = (psVar8->value).second;
          bVar37 = 0x80;
        }
        set_ctrl(this,i,bVar37);
      }
LAB_001fb2c6:
      i = i + 1;
      sVar32 = this->capacity_;
    } while (i != sVar32);
  }
  reset_growth_left(this,sVar32);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}